

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

void google::protobuf::internal::GenericSwap(Message *lhs,Message *rhs)

{
  MessageLite *pMVar1;
  Arena *extraout_RAX;
  Arena *extraout_RAX_00;
  Arena *pAVar2;
  Arena *pAVar3;
  Arena *pAVar4;
  MessageLite *other;
  Arena *arena;
  MessageLite *this;
  Metadata MVar5;
  MessageLite MStack_28;
  
  pMVar1 = &MStack_28;
  this = &MStack_28;
  pAVar2 = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  pAVar3 = pAVar2;
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  arena = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  pAVar4 = arena;
  if (((ulong)arena & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (pAVar3 == pAVar4) {
    GenericSwap((internal *)&MStack_28);
    pAVar2 = extraout_RAX;
LAB_002f44b3:
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  else {
    pAVar3 = pAVar2;
    pMVar1 = &lhs->super_MessageLite;
    if (((ulong)pAVar2 & 1) != 0) goto LAB_002f44b3;
  }
  if (pAVar3 == (Arena *)0x0) {
    pAVar3 = arena;
    if (((ulong)arena & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    if (pAVar3 != (Arena *)0x0) goto LAB_002f4425;
    GenericSwap((internal *)&MStack_28);
    pAVar2 = extraout_RAX_00;
  }
  else {
LAB_002f4425:
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    other = pMVar1;
    this = &rhs->super_MessageLite;
    if ((arena != (Arena *)0x0) ||
       (other = &rhs->super_MessageLite, arena = pAVar2, this = pMVar1, ((ulong)pAVar2 & 1) == 0))
    goto LAB_002f444a;
  }
  other = &rhs->super_MessageLite;
  arena = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
LAB_002f444a:
  pMVar1 = MessageLite::New(this,arena);
  MessageLite::CheckTypeAndMergeFrom(pMVar1,other);
  (*other->_vptr_MessageLite[2])(other);
  MessageLite::CheckTypeAndMergeFrom(other,this);
  MVar5 = Message::GetMetadata((Message *)this);
  Reflection::Swap(MVar5.reflection,(Message *)pMVar1,(Message *)this);
  return;
}

Assistant:

void GenericSwap(Message* lhs, Message* rhs) {
  if (!internal::DebugHardenForceCopyInSwap()) {
    ABSL_DCHECK(lhs->GetArena() != rhs->GetArena());
    ABSL_DCHECK(lhs->GetArena() != nullptr || rhs->GetArena() != nullptr);
  }
  // At least one of these must have an arena, so make `rhs` point to it.
  Arena* arena = rhs->GetArena();
  if (arena == nullptr) {
    std::swap(lhs, rhs);
    arena = rhs->GetArena();
  }

  // Improve efficiency by placing the temporary on an arena so that messages
  // are copied twice rather than three times.
  Message* tmp = rhs->New(arena);
  tmp->CheckTypeAndMergeFrom(*lhs);
  lhs->Clear();
  lhs->CheckTypeAndMergeFrom(*rhs);
  if (internal::DebugHardenForceCopyInSwap()) {
    rhs->Clear();
    rhs->CheckTypeAndMergeFrom(*tmp);
    if (arena == nullptr) delete tmp;
  } else {
    rhs->GetReflection()->Swap(tmp, rhs);
  }
}